

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,rt_interval<viennamath::rt_expression_interface<double>_> *e)

{
  ostream *poVar1;
  rt_expr<viennamath::rt_expression_interface<double>_> *prVar2;
  rt_interval<viennamath::rt_expression_interface<double>_> *e_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,"interval(");
  prVar2 = rt_interval<viennamath::rt_expression_interface<double>_>::lower(e);
  poVar1 = operator<<(poVar1,prVar2);
  poVar1 = std::operator<<(poVar1,", ");
  prVar2 = rt_interval<viennamath::rt_expression_interface<double>_>::upper(e);
  poVar1 = operator<<(poVar1,prVar2);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_interval<InterfaceType> const & e)
  {
    stream << "interval(" << e.lower() << ", " << e.upper() << ")";
    return stream;
  }